

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lira_term.h
# Opt level: O3

void __thiscall
viras::
LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
::LiraTerm(LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
           *this)

{
  (this->self).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .inner._content = 2;
  (this->x).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .inner.super_TermList._content = 2;
  (this->lim).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .inner._content = 2;
  Kernel::RationalConstantType::RationalConstantType
            (&(this->sslp).
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              .inner.super_RationalConstantType);
  Kernel::RationalConstantType::RationalConstantType
            (&(this->oslp).
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              .inner.super_RationalConstantType);
  Kernel::RationalConstantType::RationalConstantType
            (&(this->per).
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              .inner.super_RationalConstantType);
  Kernel::RationalConstantType::RationalConstantType
            (&(this->deltaY).
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              .inner.super_RationalConstantType);
  (this->distYminus).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .inner._content = 2;
  (this->breaks).
  super__Vector_base<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->breaks).
  super__Vector_base<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breaks).
  super__Vector_base<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

LiraTerm() {}